

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datumtest.cpp
# Opt level: O2

int testDatumPushPopString(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  int local_140;
  VRString g;
  VRString local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  VRString f;
  VRDatumString a;
  VRString h;
  
  local_140 = 0;
  iVar3 = 10;
  while( true ) {
    bVar4 = iVar3 == 0;
    iVar3 = iVar3 + -1;
    if (bVar4) break;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&f,"hello",
               (allocator<char> *)
               &a.
                super_VRDatumSpecialized<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(MinVR::VRCORETYPE_ID)3>
              );
    std::__cxx11::string::string((string *)&local_118,(string *)&f);
    MinVR::VRDatumString::VRDatumString
              ((VRDatumString *)
               &a.
                super_VRDatumSpecialized<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(MinVR::VRCORETYPE_ID)3>
               ,&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    a.
    super_VRDatumSpecialized<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(MinVR::VRCORETYPE_ID)3>
    .needPush = true;
    a.
    super_VRDatumSpecialized<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(MinVR::VRCORETYPE_ID)3>
    .stackFrame = a.
                  super_VRDatumSpecialized<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(MinVR::VRCORETYPE_ID)3>
                  .stackFrame + 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,"good-bye",(allocator<char> *)&g);
    MinVR::
    VRDatumSpecialized<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(MinVR::VRCORETYPE_ID)3>
    ::setValue(&a.
                super_VRDatumSpecialized<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(MinVR::VRCORETYPE_ID)3>
               ,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    (*a.
      super_VRDatumSpecialized<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(MinVR::VRCORETYPE_ID)3>
      .super_VRDatum._vptr_VRDatum[2])
              (&g,&a.
                   super_VRDatumSpecialized<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(MinVR::VRCORETYPE_ID)3>
              );
    iVar1 = std::__cxx11::string::compare((char *)&g);
    MinVR::
    VRDatumSpecialized<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(MinVR::VRCORETYPE_ID)3>
    ::pop(&a.
           super_VRDatumSpecialized<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(MinVR::VRCORETYPE_ID)3>
         );
    (*a.
      super_VRDatumSpecialized<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(MinVR::VRCORETYPE_ID)3>
      .super_VRDatum._vptr_VRDatum[2])
              (&h,&a.
                   super_VRDatumSpecialized<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(MinVR::VRCORETYPE_ID)3>
              );
    iVar2 = std::__cxx11::string::compare((char *)&h);
    local_140 = iVar2 + iVar1 + local_140;
    std::__cxx11::string::~string((string *)&h);
    std::__cxx11::string::~string((string *)&g);
    MinVR::
    VRDatumSpecialized<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(MinVR::VRCORETYPE_ID)3>
    ::~VRDatumSpecialized
              (&a.
                super_VRDatumSpecialized<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(MinVR::VRCORETYPE_ID)3>
              );
    std::__cxx11::string::~string((string *)&f);
  }
  return local_140;
}

Assistant:

int testDatumPushPopString() {

  int out = 0;

  LOOP {

    MinVR::VRString f = "hello";
    MinVR::VRDatumString a = MinVR::VRDatumString(f);

    a.push();
    a.setValue("good-bye");
    MinVR::VRString g = a.getValue();
    out += g.compare("good-bye");

    a.pop();
    MinVR::VRString h = a.getValue();
    out += h.compare("hello");
  }